

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_writer_add_mem_ex_v2
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32,time_t *last_modified,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_uint64 cur_file_ofs;
  mz_zip_internal_state *pArray;
  mz_uint8 *pmVar1;
  ulong uVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  mz_bool mVar5;
  tdefl_status tVar6;
  mz_uint32 mVar7;
  time_t *ptVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  undefined4 extraout_var;
  mz_uint64 *pmVar12;
  mz_uint64 *pmVar13;
  char cVar14;
  ushort bit_flags;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  mz_uint64 *pmVar18;
  long lVar19;
  undefined1 uVar20;
  int iVar21;
  char *pcVar22;
  int iVar23;
  long lVar24;
  undefined6 in_register_0000008a;
  byte bVar25;
  uint uVar26;
  uint uVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  bool local_139;
  mz_uint64 local_138;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint8 *local_128;
  ulong local_120;
  tdefl_compressor *local_118;
  size_t local_110;
  mz_uint64 comp_size;
  char *local_100;
  mz_zip_writer_add_state state;
  mz_uint64 local_dir_header_ofs;
  uint local_cc;
  uint local_c8;
  int local_c4;
  ulong local_c0;
  time_t cur_time;
  undefined1 uStack_b0;
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  undefined1 uStack_ac;
  undefined1 uStack_ab;
  undefined2 uStack_aa;
  undefined6 uStack_a8;
  undefined4 uStack_a2;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  mz_uint8 *local_98;
  mz_ulong local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  ulong local_70;
  undefined8 local_68;
  void *local_60;
  mz_uint8 extra_data [28];
  
  local_120 = CONCAT44(local_120._4_4_,(int)CONCAT62(in_register_0000008a,comment_size));
  dos_time = 0;
  dos_date = 0;
  cur_file_ofs = pZip->m_archive_size;
  comp_size = 0;
  uVar27 = 6;
  if (-1 < (int)level_and_flags) {
    uVar27 = level_and_flags;
  }
  if (uncomp_size == 0) {
    bit_flags = (ushort)((uVar27 & 0x400) == 0 && buf_size != 0) << 3;
  }
  else {
    bit_flags = 8;
  }
  uVar26 = uVar27 & 0x400;
  pArray = pZip->m_pState;
  if ((uVar27 >> 0x10 & 1) == 0) {
    bit_flags = bit_flags + 0x800;
  }
  uVar27 = uVar27 & 0xf;
  bVar28 = uVar27 == 0;
  if ((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
LAB_0013450e:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if ((pArchive_name == (char *)0x0) ||
     ((pBuf == (void *)0x0 && buf_size != 0 ||
      (pComment == (void *)0x0 && comment_size != 0 || 10 < uVar27)))) goto LAB_0013450e;
  if (pArray->m_zip64 == 0) {
    if ((uncomp_size | buf_size) >> 0x20 != 0 || pZip->m_total_files == 0xffff) {
      pArray->m_zip64 = 1;
    }
  }
  else if (pZip->m_total_files == 0xffffffff) {
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  if (uncomp_size != 0 && uVar26 == 0) goto LAB_0013450e;
  cVar14 = *pArchive_name;
  if (cVar14 == '/') {
LAB_0013459a:
    pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  local_90 = (ulong)uncomp_crc32;
  local_78 = (undefined1 *)((long)&state.m_cur_archive_file_ofs + 7);
  local_80 = (undefined1 *)((long)&state.m_cur_archive_file_ofs + 6);
  local_88 = (undefined1 *)((long)&state.m_cur_archive_file_ofs + 5);
  pcVar22 = pArchive_name + 1;
  while (cVar14 != '\0') {
    if ((cVar14 == ':') || (cVar14 == '\\')) {
      if (pZip == (mz_zip_archive *)0x0) {
        return 0;
      }
      goto LAB_0013459a;
    }
    cVar14 = *pcVar22;
    pcVar22 = pcVar22 + 1;
  }
  local_98 = (mz_uint8 *)pBuf;
  local_60 = pComment;
  ptVar8 = last_modified;
  local_110 = buf_size;
  local_100 = pArchive_name;
  local_dir_header_ofs = cur_file_ofs;
  if (last_modified == (time_t *)0x0) {
    time(&cur_time);
    ptVar8 = &cur_time;
  }
  mz_zip_time_t_to_dos_time(*ptVar8,&dos_time,&dos_date);
  if (uVar26 == 0) {
    local_90 = mz_crc32(0,local_98,local_110);
    uncomp_size = local_110;
    if (local_110 < 4) {
      uVar27 = 0;
    }
    local_139 = local_110 < 4 || (bVar28 || uVar26 != 0);
  }
  else {
    local_139 = true;
  }
  sVar9 = strlen(local_100);
  if (0xffff < sVar9) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
      return 0;
    }
    return 0;
  }
  if (pZip->m_file_offset_alignment == 0) {
    local_128 = (mz_uint8 *)0x0;
  }
  else {
    iVar23 = (int)pZip->m_file_offset_alignment;
    uVar15 = iVar23 - 1;
    local_128 = (mz_uint8 *)(ulong)(iVar23 - ((uint)pZip->m_archive_size & uVar15) & uVar15);
  }
  local_70 = local_120 & 0xffff;
  sVar10 = (pArray->m_central_dir).m_size;
  if (0xfffffffe < sVar10 + 0x4a + local_70 + sVar9) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  lVar16 = 0x1c;
  if (pArray->m_zip64 == 0) {
    if (local_128 +
        pZip->m_archive_size +
        sVar10 + (ulong)user_extra_data_central_len + (ulong)user_extra_data_len +
                 (local_70 - 0xffffff8e) + sVar9 * 2 < (mz_uint8 *)0xffffffff00000000) {
      pArray->m_zip64 = 1;
    }
    else {
      lVar16 = 0;
    }
  }
  local_68 = 0;
  if (((sVar9 != 0) && (local_100[sVar9 - 1] == '/')) &&
     (local_68 = 0x10, uncomp_size != 0 || local_110 != 0)) goto LAB_0013450e;
  uVar17 = lVar16 + 0x2e + local_70 + sVar9 + sVar10;
  local_120 = sVar9;
  if ((((pArray->m_central_dir).m_capacity < uVar17) &&
      (mVar5 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar17,1), mVar5 == 0)) ||
     ((uVar17 = (pArray->m_central_dir_offsets).m_size + 1,
      (pArray->m_central_dir_offsets).m_capacity < uVar17 &&
      (mVar5 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar17,1),
      mVar5 == 0)))) {
LAB_00134896:
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    return 0;
  }
  if (local_110 == 0 || local_139 != false) {
    local_118 = (tdefl_compressor *)0x0;
  }
  else {
    local_118 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
    if (local_118 == (tdefl_compressor *)0x0) goto LAB_00134896;
  }
  pmVar1 = local_128;
  mVar5 = mz_zip_writer_write_zeros(pZip,cur_file_ofs,(mz_uint32)local_128);
  if (mVar5 == 0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
    return 0;
  }
  local_dir_header_ofs = local_dir_header_ofs + ((ulong)pmVar1 & 0xffffffff);
  if ((pZip->m_file_offset_alignment != 0) &&
     ((pZip->m_file_offset_alignment - 1 & local_dir_header_ofs) != 0)) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                  ,0x1eb0,
                  "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  uStack_a8 = 0;
  uStack_a2 = 0;
  uStack_9e = 0;
  uStack_9d = 0;
  uStack_9c = 0;
  uStack_9b = 0;
  cur_time._0_4_ = 0;
  cur_time._4_1_ = 0;
  cur_time._5_1_ = 0;
  cur_time._6_1_ = 0;
  cur_time._7_1_ = 0;
  uStack_b0 = 0;
  uStack_af = 0;
  uStack_ae = 0;
  uStack_ad = 0;
  uStack_ac = 0;
  uStack_ab = 0;
  uStack_aa = 0;
  uVar17 = cur_file_ofs + ((ulong)pmVar1 & 0xffffffff);
  bVar25 = local_139 ^ 1U | uVar26 != 0;
  iVar23 = (uint)bVar25 << 3;
  uVar20 = (undefined1)(bit_flags >> 8);
  local_c4 = iVar23;
  if (pArray->m_zip64 == 0) {
    if ((comp_size._4_4_ != 0) || (uVar17 >> 0x20 != 0)) goto LAB_00134da9;
    cur_time._4_1_ = 0x14;
    if (bVar25 == 0) {
      cur_time._4_1_ = 0;
    }
    cur_time._0_4_ = 0x4034b50;
    uStack_ae = (undefined1)dos_time;
    uStack_ad = (undefined1)(dos_time >> 8);
    local_c8 = (uint)dos_time;
    uStack_ac = (undefined1)dos_date;
    uStack_ab = (undefined1)(dos_date >> 8);
    local_cc = (uint)dos_date;
    uStack_a2 = 0;
    uStack_aa = 0;
    uStack_a8 = 0;
    uStack_9e = (undefined1)local_120;
    uStack_9d = (undefined1)(local_120 >> 8);
    uStack_9c = (undefined1)user_extra_data_len;
    uStack_9b = (undefined1)(user_extra_data_len >> 8);
    cur_time._6_1_ = (char)bit_flags;
    cur_time._7_1_ = uVar20;
    uStack_b0 = (char)iVar23;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&cur_time,0x1e);
    uVar2 = local_120;
    if (sVar10 != 0x1e) goto LAB_00134b2d;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar17 + 0x1e,local_100,local_120);
    if (sVar10 == uVar2) {
      local_128 = (mz_uint8 *)0x0;
      local_c0 = 0;
      local_138 = uVar17 + 0x1e + local_120;
      goto LAB_00134b42;
    }
  }
  else {
    if ((uncomp_size < 0xffffffff) && (local_dir_header_ofs < 0xffffffff)) {
      local_128 = (mz_uint8 *)0x0;
      local_c0 = 0;
    }
    else {
      pmVar12 = (mz_uint64 *)0x0;
      pmVar13 = &comp_size;
      pmVar18 = &uncomp_size;
      if (uncomp_size < 0xffffffff) {
        pmVar13 = pmVar12;
        pmVar18 = pmVar12;
      }
      local_128 = extra_data;
      if (0xfffffffe < local_dir_header_ofs) {
        pmVar12 = &local_dir_header_ofs;
      }
      mVar7 = mz_zip_writer_create_zip64_extra_data(local_128,pmVar18,pmVar13,pmVar12);
      local_c0 = (ulong)mVar7;
    }
    uVar2 = local_120;
    cur_time._0_4_ = 0x4034b50;
    iVar21 = (int)local_c0 + user_extra_data_len;
    cur_time._4_1_ = 0x14;
    if (bVar25 == 0) {
      cur_time._4_1_ = 0;
    }
    cur_time._5_1_ = 0;
    uStack_af = 0;
    uStack_ae = (undefined1)dos_time;
    uStack_ad = (undefined1)(dos_time >> 8);
    local_c8 = (uint)dos_time;
    uStack_ac = (undefined1)dos_date;
    uStack_ab = (undefined1)(dos_date >> 8);
    uStack_a2 = 0;
    uStack_aa = 0;
    uStack_a8 = 0;
    local_cc = (uint)dos_date;
    uStack_9e = (undefined1)local_120;
    uStack_9d = (undefined1)(local_120 >> 8);
    uStack_9c = (undefined1)iVar21;
    uStack_9b = (undefined1)((uint)iVar21 >> 8);
    cur_time._6_1_ = (char)bit_flags;
    cur_time._7_1_ = uVar20;
    uStack_b0 = (char)iVar23;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&cur_time,0x1e);
    if (sVar10 != 0x1e) goto LAB_00134b2d;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar17 + 0x1e,local_100,uVar2);
    if (sVar10 == uVar2) {
      local_138 = uVar17 + 0x1e + uVar2;
      if (local_128 == (mz_uint8 *)0x0) {
        local_128 = (mz_uint8 *)0x0;
      }
      else {
        uVar17 = local_c0 & 0xffffffff;
        sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_138,extra_data,uVar17);
        if (sVar10 != uVar17) goto LAB_00134d88;
        local_138 = local_138 + uVar17;
      }
LAB_00134b42:
      if (user_extra_data_len != 0) {
        uVar17 = (ulong)user_extra_data_len;
        sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_138,user_extra_data,uVar17);
        if (sVar10 != uVar17) goto LAB_00134d88;
        local_138 = local_138 + uVar17;
      }
      sVar10 = local_110;
      if (local_139 == false) {
        if (local_110 != 0) {
          state.m_cur_archive_file_ofs = local_138;
          state.m_comp_size = 0;
          uVar17 = 10;
          if (uVar27 < 10) {
            uVar17 = (ulong)uVar27;
          }
          uVar15 = (uint)(uVar27 < 4) << 0xe | s_tdefl_num_probes[uVar17];
          uVar26 = uVar15 | 0x80000;
          if (uVar27 != 0) {
            uVar26 = uVar15;
          }
          state.m_pZip = pZip;
          tVar6 = tdefl_init(local_118,mz_zip_writer_add_put_buf_callback,&state,uVar26);
          if ((tVar6 != TDEFL_STATUS_OKAY) ||
             (tVar6 = tdefl_compress_buffer(local_118,local_98,local_110,TDEFL_FINISH),
             tVar6 != TDEFL_STATUS_DONE)) {
            (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
            pZip->m_last_error = MZ_ZIP_COMPRESSION_FAILED;
            return 0;
          }
          local_138 = state.m_cur_archive_file_ofs;
          comp_size = state.m_comp_size;
        }
      }
      else {
        sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_138,local_98,local_110);
        if (sVar11 != sVar10) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
LAB_00134d88:
          pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
          return 0;
        }
        local_138 = local_138 + local_110;
        comp_size = local_110;
      }
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
      if (uncomp_size == 0) {
        uVar17 = 0;
      }
      else {
        if ((bit_flags & 8) == 0) {
          __assert_fail("bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR",
                        "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                        ,0x1f39,
                        "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                       );
        }
        state.m_pZip = (mz_zip_archive *)
                       CONCAT17((char)(local_90 >> 0x18),
                                CONCAT16((char)(local_90 >> 0x10),
                                         CONCAT15((char)(local_90 >> 8),
                                                  CONCAT14((char)local_90,0x8074b50))));
        uVar20 = (undefined1)uncomp_size;
        if (local_128 == (mz_uint8 *)0x0) {
          if (comp_size >> 0x20 != 0) {
LAB_00134da9:
            pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
            return 0;
          }
          pmVar18 = &state.m_cur_archive_file_ofs;
          lVar19 = 0x10;
          lVar24 = 8;
          sVar10 = 0x10;
          state.m_cur_archive_file_ofs = CONCAT44(state.m_cur_archive_file_ofs._4_4_,(int)comp_size)
          ;
          lVar16 = 0x18;
        }
        else {
          pmVar18 = &state.m_comp_size;
          local_88 = (undefined1 *)((long)&state.m_comp_size + 5);
          uVar20 = (undefined1)(uncomp_size >> 0x20);
          sVar10 = 0x18;
          lVar24 = 0x28;
          local_80 = (undefined1 *)((long)&state.m_comp_size + 6);
          local_78 = (undefined1 *)((long)&state.m_comp_size + 7);
          auVar30 = vpbroadcastq_avx512vl();
          auVar30 = vpsrlvq_avx2(auVar30,_DAT_00158040);
          auVar29 = vpmovqb_avx512vl(auVar30);
          state.m_cur_archive_file_ofs =
               CONCAT17((char)(comp_size >> 0x38),
                        CONCAT16((char)(comp_size >> 0x30),
                                 CONCAT15((char)(comp_size >> 0x28),
                                          CONCAT41(auVar29._0_4_,(char)comp_size))));
          lVar19 = 0x30;
          state.m_comp_size._0_4_ = (undefined4)uncomp_size;
          lVar16 = 0x38;
        }
        puVar3 = local_80;
        *(undefined1 *)((long)pmVar18 + 4) = uVar20;
        *local_88 = (char)(uncomp_size >> lVar24);
        puVar4 = local_78;
        *puVar3 = (char)(uncomp_size >> lVar19);
        *puVar4 = (char)(uncomp_size >> lVar16);
        sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_138,&state,sVar10);
        if (sVar11 != sVar10) {
          return 0;
        }
        local_138 = local_138 + sVar10;
        uVar17 = uncomp_size;
      }
      if (local_128 != (mz_uint8 *)0x0) {
        pmVar12 = &uncomp_size;
        pmVar18 = &comp_size;
        if (uVar17 < 0xffffffff) {
          pmVar18 = (mz_uint64 *)0x0;
          pmVar12 = (mz_uint64 *)0x0;
        }
        pmVar13 = (mz_uint64 *)0x0;
        if (0xfffffffe < local_dir_header_ofs) {
          pmVar13 = &local_dir_header_ofs;
        }
        mVar7 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar12,pmVar18,pmVar13);
        local_c0 = CONCAT44(extraout_var,mVar7);
        uVar17 = uncomp_size;
      }
      mVar5 = mz_zip_writer_add_to_central_dir
                        (pZip,local_100,(mz_uint16)local_120,local_128,(mz_uint16)local_c0,local_60,
                         (mz_uint16)local_70,uVar17,comp_size,(mz_uint32)local_90,
                         (mz_uint16)local_c4,bit_flags,(mz_uint16)local_c8,(mz_uint16)local_cc,
                         local_dir_header_ofs,(mz_uint32)local_68,user_extra_data_central,
                         user_extra_data_central_len);
      if (mVar5 == 0) {
        return 0;
      }
      pZip->m_total_files = pZip->m_total_files + 1;
      pZip->m_archive_size = local_138;
      return 1;
    }
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
LAB_00134b2d:
  pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
  return 0;
}

Assistant:

inline mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive* pZip,
                                           const char* pArchive_name,
                                           const void* pBuf,
                                           size_t buf_size,
                                           const void* pComment,
                                           mz_uint16 comment_size,
                                           mz_uint level_and_flags,
                                           mz_uint64 uncomp_size,
                                           mz_uint32 uncomp_crc32,
                                           MZ_TIME_T* last_modified,
                                           const char* user_extra_data,
                                           mz_uint user_extra_data_len,
                                           const char* user_extra_data_central,
                                           mz_uint user_extra_data_central_len) {

    mz_uint16 method = 0, dos_time = 0, dos_date = 0;
    mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
    mz_uint64 local_dir_header_ofs = pZip->m_archive_size, cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
    size_t archive_name_size;
    mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
    tdefl_compressor* pComp = NULL;
    mz_bool store_data_uncompressed;
    mz_zip_internal_state* pState;
    mz_uint8* pExtra_data = NULL;
    mz_uint32 extra_size = 0;
    mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
    mz_uint16 bit_flags = 0;

    if ((int)level_and_flags < 0)
        level_and_flags = MZ_DEFAULT_LEVEL;

    if (uncomp_size || (buf_size && !(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)))
        bit_flags |= MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;

    if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
        bit_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

    level = level_and_flags & 0xF;
    store_data_uncompressed = ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf))
            || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if (pState->m_zip64) {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else {
        if (pZip->m_total_files == MZ_UINT16_MAX) {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
        }
        if ((buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF)) {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_validate_archive_name(pArchive_name))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

#ifndef MINIZ_NO_TIME
    if (last_modified != NULL) {
        mz_zip_time_t_to_dos_time(*last_modified, &dos_time, &dos_date);
    }
    else {
        MZ_TIME_T cur_time;
        time(&cur_time);
        mz_zip_time_t_to_dos_time(cur_time, &dos_time, &dos_date);
    }
#endif /* #ifndef MINIZ_NO_TIME */

    if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
        uncomp_crc32 = (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8*)pBuf, buf_size);
        uncomp_size = buf_size;
        if (uncomp_size <= 3) {
            level = 0;
            store_data_uncompressed = MZ_TRUE;
        }
    }

    archive_name_size = strlen(pArchive_name);
    if (archive_name_size > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size
            + MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!pState->m_zip64) {
        /* Bail early if the archive would obviously become too large */
        if ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size
                + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + user_extra_data_len
                + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + user_extra_data_central_len
                + MZ_ZIP_DATA_DESCRIPTER_SIZE32) > 0xFFFFFFFF) {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/')) {
        /* Set DOS Subdirectory attribute bit. */
        ext_attributes |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;

        /* Subdirectories cannot contain data. */
        if ((buf_size) || (uncomp_size))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
    }

    /* Try to do any allocations before writing to the archive, so if an allocation fails the file remains unmodified. (A good idea if we're doing an in-place modification.) */
    if ((!mz_zip_array_ensure_room(pZip,
                                   &pState->m_central_dir,
                                   MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size
                                           + (pState->m_zip64 ? MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE : 0)))
            || (!mz_zip_array_ensure_room(
                    pZip,
                    &pState->m_central_dir_offsets,
                    1)))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if ((!store_data_uncompressed) && (buf_size)) {
        if (NULL == (pComp = (tdefl_compressor*)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes)) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        return MZ_FALSE;
    }

    local_dir_header_ofs += num_alignment_padding_bytes;
    if (pZip->m_file_offset_alignment) {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }
    cur_archive_file_ofs += num_alignment_padding_bytes;

    MZ_CLEAR_OBJ(local_dir_header);

    if (!store_data_uncompressed || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
        method = MZ_DEFLATED;
    }

    if (pState->m_zip64) {
        if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX) {
            pExtra_data = extra_data;
            extra_size = mz_zip_writer_create_zip64_extra_data(extra_data,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
                                                               (local_dir_header_ofs >= MZ_UINT32_MAX)
                                                               ? &local_dir_header_ofs : NULL);
        }

        if (!mz_zip_writer_create_local_dir_header(pZip,
                                                   local_dir_header,
                                                   (mz_uint16)archive_name_size,
                                                   extra_size + user_extra_data_len,
                                                   0,
                                                   0,
                                                   0,
                                                   method,
                                                   bit_flags,
                                                   dos_time,
                                                   dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           local_dir_header_ofs,
                           local_dir_header,
                           sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size)
                != archive_name_size) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;

        if (pExtra_data != NULL) {
            if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data, extra_size) != extra_size)
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

            cur_archive_file_ofs += extra_size;
        }
    }
    else {
        if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
        if (!mz_zip_writer_create_local_dir_header(pZip,
                                                   local_dir_header,
                                                   (mz_uint16)archive_name_size,
                                                   user_extra_data_len,
                                                   0,
                                                   0,
                                                   0,
                                                   method,
                                                   bit_flags,
                                                   dos_time,
                                                   dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           local_dir_header_ofs,
                           local_dir_header,
                           sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size)
                != archive_name_size) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;
    }

    if (user_extra_data_len > 0) {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, user_extra_data, user_extra_data_len)
                != user_extra_data_len)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += user_extra_data_len;
    }

    if (store_data_uncompressed) {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf, buf_size) != buf_size) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += buf_size;
        comp_size = buf_size;
    }
    else if (buf_size) {
        mz_zip_writer_add_state state;

        state.m_pZip = pZip;
        state.m_cur_archive_file_ofs = cur_archive_file_ofs;
        state.m_comp_size = 0;

        if ((tdefl_init(pComp,
                        mz_zip_writer_add_put_buf_callback,
                        &state,
                        tdefl_create_comp_flags_from_zip_params(level,
                                                                -15,
                                                                MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY)
                || (tdefl_compress_buffer(
                        pComp,
                        pBuf,
                        buf_size,
                        TDEFL_FINISH) != TDEFL_STATUS_DONE)) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
        }

        comp_size = state.m_comp_size;
        cur_archive_file_ofs = state.m_cur_archive_file_ofs;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    pComp = NULL;

    if (uncomp_size) {
        mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
        mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

        MZ_ASSERT(bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR);

        MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
        MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
        if (pExtra_data == NULL) {
            if (comp_size > MZ_UINT32_MAX)
                return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

            MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
        }
        else {
            MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
            local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           cur_archive_file_ofs,
                           local_dir_footer,
                           local_dir_footer_size) != local_dir_footer_size)
            return MZ_FALSE;

        cur_archive_file_ofs += local_dir_footer_size;
    }

    if (pExtra_data != NULL) {
        extra_size = mz_zip_writer_create_zip64_extra_data(extra_data,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
                                                           (local_dir_header_ofs >= MZ_UINT32_MAX)
                                                           ? &local_dir_header_ofs : NULL);
    }

    if (!mz_zip_writer_add_to_central_dir(pZip,
                                          pArchive_name,
                                          (mz_uint16)archive_name_size,
                                          pExtra_data,
                                          extra_size,
                                          pComment,
                                          comment_size,
                                          uncomp_size,
                                          comp_size,
                                          uncomp_crc32,
                                          method,
                                          bit_flags,
                                          dos_time,
                                          dos_date,
                                          local_dir_header_ofs,
                                          ext_attributes,
                                          user_extra_data_central,
                                          user_extra_data_central_len))
        return MZ_FALSE;

    pZip->m_total_files++;
    pZip->m_archive_size = cur_archive_file_ofs;

    return MZ_TRUE;
}